

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

bool __thiscall
amrex::BoxArray::contains(BoxArray *this,BoxArray *ba,bool assume_disjoint_ba,IntVect *ng)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Box local_78;
  ulong local_58;
  Box local_4c;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8) !=
      (peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    minimalBox(&local_78,this);
    iVar7 = (int)((ulong)*(undefined8 *)(ng->vect + 1) >> 0x20);
    iVar6 = (int)*(undefined8 *)(ng->vect + 1);
    local_78.bigend.vect[0] = ng->vect[0] + local_78.bigend.vect[0];
    local_78.smallend.vect[0] = local_78.smallend.vect[0] - ng->vect[0];
    local_78.smallend.vect[1] = local_78.smallend.vect[1] - iVar6;
    local_78.smallend.vect[2] = local_78.smallend.vect[2] - iVar7;
    local_78.bigend.vect[1] = local_78.bigend.vect[1] + iVar6;
    local_78.bigend.vect[2] = local_78.bigend.vect[2] + iVar7;
    minimalBox(&local_4c,ba);
    if ((((local_78.smallend.vect[0] <= local_4c.smallend.vect[0]) &&
         (local_78.smallend.vect[1] <= local_4c.smallend.vect[1])) &&
        (local_78.smallend.vect[2] <= local_4c.smallend.vect[2])) &&
       (((local_4c.bigend.vect[0] <= local_78.bigend.vect[0] &&
         (local_4c.bigend.vect[1] <= local_78.bigend.vect[1])) &&
        (local_4c.bigend.vect[2] <= local_78.bigend.vect[2])))) {
      peVar1 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar3 = (int)((long)*(pointer *)
                           ((long)&(peVar1->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data >> 2) * -0x49249249;
      if ((int)uVar3 < 1) {
        return true;
      }
      local_58 = (ulong)(uVar3 & 0x7fffffff);
      lVar5 = 0;
      uVar4 = 0;
      while( true ) {
        BATransformer::operator()
                  (&local_78,&ba->m_bat,
                   (Box *)(*(long *)&(((ba->m_ref).
                                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar5));
        bVar2 = contains(this,&local_78,assume_disjoint_ba,ng);
        if (!bVar2) break;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x1c;
        if (local_58 == uVar4) {
          return local_58 <= uVar4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
BoxArray::contains (const BoxArray& ba, bool assume_disjoint_ba, const IntVect& ng) const
{
    if (size() == 0) return false;

    if (!minimalBox().grow(ng).contains(ba.minimalBox())) return false;

    for (int i = 0, N = ba.size(); i < N; ++i) {
        if (!contains(ba[i],assume_disjoint_ba, ng)) {
            return false;
        }
    }

    return true;
}